

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_format_specs<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                    *handler)

{
  uint_least8_t *puVar1;
  char cVar2;
  type tVar3;
  basic_format_specs<wchar_t> *pbVar4;
  bool bVar5;
  bool bVar6;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *psVar7;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *psVar8;
  wchar_t wVar9;
  ulong uVar10;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *psVar11;
  uint uVar12;
  wchar_t c;
  char *message;
  basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
  *this;
  alignment aVar13;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
  *local_40;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
  local_38;
  
  if (begin == end) {
    return begin;
  }
  wVar9 = *begin;
  if (wVar9 == L'}') {
    return begin;
  }
  psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
             *)(begin + 1);
  uVar10 = (ulong)(psVar11 !=
                  (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                   *)end);
  do {
    cVar2 = (char)begin[uVar10];
    bVar6 = false;
    bVar5 = true;
    if (cVar2 < '>') {
      if (cVar2 == '<') {
        aVar13 = ALIGN_LEFT;
        goto LAB_00190281;
      }
      aVar13 = ALIGN_DEFAULT;
      if (cVar2 == '=') {
        aVar13 = ALIGN_NUMERIC;
        bVar6 = true;
        bVar5 = false;
      }
    }
    else {
      if (cVar2 == '>') {
        aVar13 = ALIGN_RIGHT;
      }
      else {
        aVar13 = ALIGN_DEFAULT;
        if (cVar2 != '^') goto LAB_00190285;
        aVar13 = ALIGN_CENTER;
      }
LAB_00190281:
      bVar5 = false;
      bVar6 = false;
    }
LAB_00190285:
    if (!bVar5) {
      local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                  *)begin;
      if (0 < (long)uVar10) {
        if (wVar9 == L'{') {
          error_handler::on_error
                    ((error_handler *)
                     (handler->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                     ).context_,"invalid fill character \'{\'");
          break;
        }
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                   *)(begin + 2);
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
          ).super_specs_setter<wchar_t>.specs_)->super_align_spec).fill_ = wVar9;
      }
      if ((bVar6) && (8 < handler->arg_type_ - named_arg_type)) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      (((handler->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_)->super_align_spec).align_ = aVar13;
      begin = (wchar_t *)psVar11;
      break;
    }
    bVar5 = 0 < (long)uVar10;
    uVar10 = uVar10 - 1;
  } while (bVar5);
  if (begin == end) {
    return (wchar_t *)
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
            *)begin;
  }
  cVar2 = *(char *)&(((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                       *)begin)->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                    ).super_specs_setter<wchar_t>.specs_;
  local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
              *)begin;
  if (cVar2 == ' ') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    tVar3 = handler->arg_type_;
    if ((tVar3 - named_arg_type < 7) &&
       ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ).context_,"format specifier requires signed argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 1;
LAB_00190435:
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                          ).super_specs_setter<wchar_t>.specs_ + 4);
  }
  else {
    if (cVar2 == '-') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar3 = handler->arg_type_;
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 4;
      goto LAB_00190435;
    }
    if (cVar2 == '+') {
      if (8 < handler->arg_type_ - named_arg_type) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"format specifier requires numeric argument");
      }
      tVar3 = handler->arg_type_;
      if ((tVar3 - named_arg_type < 7) &&
         ((char_type < tVar3 || ((0x94U >> (tVar3 & 0x1f) & 1) == 0)))) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"format specifier requires signed argument");
      }
      puVar1 = &(((handler->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                  ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
      *puVar1 = *puVar1 | 3;
      goto LAB_00190435;
    }
  }
  if (local_40 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
       *)end) {
    return (wchar_t *)local_40;
  }
  if (*(wchar_t *)
       &(local_40->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_ == L'#') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    puVar1 = &(((handler->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).flags;
    *puVar1 = *puVar1 | 8;
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                          ).super_specs_setter<wchar_t>.specs_ + 4);
    if (local_40 ==
        (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
         *)end) {
      return (wchar_t *)local_40;
    }
  }
  if (*(wchar_t *)
       &(local_40->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_ == L'0') {
    if (8 < handler->arg_type_ - named_arg_type) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ).context_,"format specifier requires numeric argument");
    }
    pbVar4 = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             ).super_specs_setter<wchar_t>.specs_;
    (pbVar4->super_align_spec).fill_ = L'0';
    (pbVar4->super_align_spec).align_ = ALIGN_NUMERIC;
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                          ).super_specs_setter<wchar_t>.specs_ + 4);
    if (local_40 ==
        (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
         *)end) {
      return (wchar_t *)local_40;
    }
  }
  wVar9 = *(wchar_t *)
           &(local_40->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
            ).super_specs_setter<wchar_t>.specs_;
  if ((uint)(wVar9 + L'\xffffffd0') < 10) {
    psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
               *)((long)&(local_40->
                         super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                         ).super_specs_setter<wchar_t>.specs_ + 4);
    uVar12 = 0;
    psVar8 = psVar11;
    if (wVar9 != L'0') {
      while (psVar11 = psVar8, uVar12 < 0xccccccd) {
        uVar12 = (*(int *)&psVar11[-1].field_0x14 + uVar12 * 10) - 0x30;
        if ((psVar11 ==
             (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
              *)end) ||
           (psVar8 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                      *)((long)&(psVar11->
                                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                                ).super_specs_setter<wchar_t>.specs_ + 4),
           9 < (uint)(*(wchar_t *)
                       &(psVar11->
                        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                        ).super_specs_setter<wchar_t>.specs_ + L'\xffffffd0'))) goto LAB_0019058c;
      }
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                 *)&psVar11[-1].field_0x14;
      uVar12 = 0x80000000;
LAB_0019058c:
      if ((int)uVar12 < 0) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"number is too big");
      }
    }
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_align_spec).width_ = uVar12;
  }
  else {
    psVar11 = local_40;
    if (wVar9 == L'{') {
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                 *)((long)&(local_40->
                           super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                           ).super_specs_setter<wchar_t>.specs_ + 4);
      if (psVar11 !=
          (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
           *)end) {
        local_38.handler = handler;
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                   *)parse_arg_id<wchar_t,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&,wchar_t>>
                               ((wchar_t *)psVar11,end,&local_38);
      }
      if ((psVar11 ==
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
            *)end) ||
         (*(wchar_t *)
           &(psVar11->
            super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
            ).super_specs_setter<wchar_t>.specs_ != L'}')) {
        error_handler::on_error
                  ((error_handler *)
                   (handler->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                   ).context_,"invalid format string");
      }
      else {
        psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                   *)((long)&(psVar11->
                             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                             ).super_specs_setter<wchar_t>.specs_ + 4);
      }
    }
  }
  if (psVar11 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
       *)end) {
    return (wchar_t *)psVar11;
  }
  local_40 = psVar11;
  if (*(wchar_t *)
       &(psVar11->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ).super_specs_setter<wchar_t>.specs_ != L'.') goto LAB_0019069c;
  local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
              *)((long)&(psVar11->
                        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                        ).super_specs_setter<wchar_t>.specs_ + 4);
  if (local_40 ==
      (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
       *)end) {
    wVar9 = L'\0';
  }
  else {
    wVar9 = *(wchar_t *)
             &(local_40->
              super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
              ).super_specs_setter<wchar_t>.specs_;
  }
  if ((uint)(wVar9 + L'\xffffffd0') < 10) {
    uVar12 = parse_nonnegative_int<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&>
                       ((wchar_t **)&local_40,end,handler);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).precision = uVar12;
LAB_001905fb:
    bVar5 = true;
    if ((handler->arg_type_ - named_arg_type < 7) || (handler->arg_type_ == pointer_type)) {
      error_handler::on_error
                ((error_handler *)
                 (handler->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                 ).context_,"precision not allowed for this argument type");
      psVar11 = handler;
    }
  }
  else {
    if (wVar9 == L'{') {
      psVar11 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                 *)&(psVar11->
                    super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                    ).context_;
      local_40 = psVar11;
      if (psVar11 !=
          (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
           *)end) {
        local_38.handler = handler;
        local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                    *)parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>>&,wchar_t>>
                                ((wchar_t *)psVar11,end,
                                 (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>_&,_wchar_t>
                                  *)&local_38);
      }
      if ((local_40 !=
           (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
            *)end) &&
         (psVar8 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                    *)((long)&(local_40->
                              super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                              ).super_specs_setter<wchar_t>.specs_ + 4),
         psVar7 = &local_40->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
         , local_40 = psVar8, *(wchar_t *)&(psVar7->super_specs_setter<wchar_t>).specs_ == L'}'))
      goto LAB_001905fb;
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             ).context_;
      message = "invalid format string";
    }
    else {
      this = (handler->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
             ).context_;
      message = "missing precision specifier";
    }
    error_handler::on_error((error_handler *)this,message);
    bVar5 = false;
    psVar11 = local_40;
  }
  if (!bVar5) {
    return (wchar_t *)psVar11;
  }
LAB_0019069c:
  if ((local_40 !=
       (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
        *)end) &&
     (wVar9 = *(wchar_t *)
               &(local_40->
                super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                ).super_specs_setter<wchar_t>.specs_, wVar9 != L'}')) {
    local_40 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_>
                *)((long)&(local_40->
                          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
                          ).super_specs_setter<wchar_t>.specs_ + 4);
    (((handler->
      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
      ).super_specs_setter<wchar_t>.specs_)->super_core_format_specs).type = (char)wVar9;
  }
  return (wchar_t *)local_40;
}

Assistant:

FMT_CONSTEXPR const Char *parse_format_specs(
    const Char *begin, const Char *end, SpecHandler &&handler) {
  if (begin == end || *begin == '}')
    return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    ++begin;
    auto c = begin != end ? *begin : 0;
    if ('0' <= c && c <= '9') {
      handler.on_precision(parse_nonnegative_int(begin, end, handler));
    } else if (c == '{') {
      ++begin;
      if (begin != end) {
        begin = parse_arg_id(
              begin, end, precision_adapter<SpecHandler, Char>(handler));
      }
      if (begin == end || *begin++ != '}')
        return handler.on_error("invalid format string"), begin;
    } else {
      return handler.on_error("missing precision specifier"), begin;
    }
    handler.end_precision();
  }

  // Parse type.
  if (begin != end && *begin != '}')
    handler.on_type(*begin++);
  return begin;
}